

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

gzip_status check_gzip_header(uchar *data,ssize_t len,ssize_t *headerlen)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  ssize_t extra_len;
  ssize_t totallen;
  int flags;
  int method;
  ssize_t *headerlen_local;
  ssize_t len_local;
  uchar *data_local;
  
  if (len < 10) {
    data_local._4_4_ = GZIP_UNDERFLOW;
  }
  else if ((*data == '\x1f') && (data[1] == 0x8b)) {
    bVar1 = data[3];
    if ((data[2] == '\b') && ((bVar1 & 0xe0) == 0)) {
      headerlen_local = (ssize_t *)(len + -10);
      len_local = (ssize_t)(data + 10);
      if ((bVar1 & 4) != 0) {
        if ((long)headerlen_local < 2) {
          return GZIP_UNDERFLOW;
        }
        lVar2 = (long)(int)(uint)*(ushort *)len_local;
        if ((long)headerlen_local < lVar2 + 2) {
          return GZIP_UNDERFLOW;
        }
        headerlen_local = (ssize_t *)((long)headerlen_local - (lVar2 + 2));
        len_local = lVar2 + 2 + len_local;
      }
      if ((bVar1 & 8) != 0) {
        while( true ) {
          bVar3 = false;
          if (headerlen_local != (ssize_t *)0x0) {
            bVar3 = *(char *)len_local != '\0';
          }
          if (!bVar3) break;
          headerlen_local = (ssize_t *)((long)headerlen_local + -1);
          len_local = len_local + 1;
        }
        if ((headerlen_local == (ssize_t *)0x0) || (*(char *)len_local != '\0')) {
          return GZIP_UNDERFLOW;
        }
        headerlen_local = (ssize_t *)((long)headerlen_local + -1);
        len_local = len_local + 1;
      }
      if ((bVar1 & 0x10) != 0) {
        while( true ) {
          bVar3 = false;
          if (headerlen_local != (ssize_t *)0x0) {
            bVar3 = *(char *)len_local != '\0';
          }
          if (!bVar3) break;
          headerlen_local = (ssize_t *)((long)headerlen_local + -1);
          len_local = len_local + 1;
        }
        if ((headerlen_local == (ssize_t *)0x0) || (*(char *)len_local != '\0')) {
          return GZIP_UNDERFLOW;
        }
        headerlen_local = (ssize_t *)((long)headerlen_local + -1);
      }
      if ((bVar1 & 2) != 0) {
        if ((long)headerlen_local < 2) {
          return GZIP_UNDERFLOW;
        }
        headerlen_local = (ssize_t *)((long)headerlen_local + -2);
      }
      *headerlen = len - (long)headerlen_local;
      data_local._4_4_ = GZIP_OK;
    }
    else {
      data_local._4_4_ = GZIP_BAD;
    }
  }
  else {
    data_local._4_4_ = GZIP_BAD;
  }
  return data_local._4_4_;
}

Assistant:

static gzip_status check_gzip_header(unsigned char const *data, ssize_t len,
                                     ssize_t *headerlen)
{
  int method, flags;
  const ssize_t totallen = len;

  /* The shortest header is 10 bytes */
  if(len < 10)
    return GZIP_UNDERFLOW;

  if((data[0] != GZIP_MAGIC_0) || (data[1] != GZIP_MAGIC_1))
    return GZIP_BAD;

  method = data[2];
  flags = data[3];

  if(method != Z_DEFLATED || (flags & RESERVED) != 0) {
    /* Can't handle this compression method or unknown flag */
    return GZIP_BAD;
  }

  /* Skip over time, xflags, OS code and all previous bytes */
  len -= 10;
  data += 10;

  if(flags & EXTRA_FIELD) {
    ssize_t extra_len;

    if(len < 2)
      return GZIP_UNDERFLOW;

    extra_len = (data[1] << 8) | data[0];

    if(len < (extra_len + 2))
      return GZIP_UNDERFLOW;

    len -= (extra_len + 2);
    data += (extra_len + 2);
  }

  if(flags & ORIG_NAME) {
    /* Skip over NUL-terminated file name */
    while(len && *data) {
      --len;
      ++data;
    }
    if(!len || *data)
      return GZIP_UNDERFLOW;

    /* Skip over the NUL */
    --len;
    ++data;
  }

  if(flags & COMMENT) {
    /* Skip over NUL-terminated comment */
    while(len && *data) {
      --len;
      ++data;
    }
    if(!len || *data)
      return GZIP_UNDERFLOW;

    /* Skip over the NUL */
    --len;
  }

  if(flags & HEAD_CRC) {
    if(len < 2)
      return GZIP_UNDERFLOW;

    len -= 2;
  }

  *headerlen = totallen - len;
  return GZIP_OK;
}